

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliasedOutline
          (EpsCopyOutputStream *this,uint32_t num,string *s,uint8_t *ptr)

{
  uint size;
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  LogMessage *other;
  uint8_t *puVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  LogFinisher local_69;
  LogMessage local_68;
  
  pbVar3 = EnsureSpace(this,ptr);
  size = (uint)s->_M_string_length;
  if (this->end_ <= pbVar3) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x36d);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: ptr < end_: ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  uVar7 = num << 3;
  *pbVar3 = (byte)uVar7 + 2;
  uVar2 = size;
  if (uVar7 < 0x80) {
    pbVar6 = pbVar3 + 1;
  }
  else {
    *pbVar3 = (byte)uVar7 | 0x82;
    pbVar3[1] = (byte)(uVar7 >> 7);
    pbVar6 = pbVar3 + 2;
    if (0x3fff < uVar7) {
      uVar5 = (uint)pbVar3[1];
      uVar7 = uVar7 >> 7;
      do {
        pbVar6[-1] = (byte)uVar5 | 0x80;
        uVar5 = uVar7 >> 7;
        *pbVar6 = (byte)uVar5;
        pbVar6 = pbVar6 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar5;
      } while (bVar1);
    }
  }
  while( true ) {
    if (uVar2 < 0x80) break;
    *pbVar6 = (byte)uVar2 | 0x80;
    uVar2 = uVar2 >> 7;
    pbVar6 = pbVar6 + 1;
  }
  *pbVar6 = (byte)uVar2;
  puVar4 = WriteRawMaybeAliased(this,(s->_M_dataplus)._M_p,size,pbVar6 + 1);
  return puVar4;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringMaybeAliasedOutline(uint32_t num,
                                                           const std::string& s,
                                                           uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRawMaybeAliased(s.data(), size, ptr);
}